

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O1

spv_result_t __thiscall
spvtools::val::ValidationState_t::RegisterFunctionEnd(ValidationState_t *this)

{
  pointer pFVar1;
  BasicBlock *pBVar2;
  
  if (this->in_function_ == false) {
    __assert_fail("in_function_body() == true && \"RegisterFunctionEnd can only be called when parsing the binary \" \"inside of another function\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validation_state.cpp"
                  ,0x209,"spv_result_t spvtools::val::ValidationState_t::RegisterFunctionEnd()");
  }
  pFVar1 = (this->module_functions_).
           super__Vector_base<spvtools::val::Function,_std::allocator<spvtools::val::Function>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if ((this->module_functions_).
      super__Vector_base<spvtools::val::Function,_std::allocator<spvtools::val::Function>_>._M_impl.
      super__Vector_impl_data._M_start != pFVar1) {
    pBVar2 = val::Function::current_block(pFVar1 + -1);
    if (pBVar2 != (BasicBlock *)0x0) {
      __assert_fail("in_block() == false && \"RegisterFunctionParameter can only be called when parsing the binary \" \"outside of a block\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validation_state.cpp"
                    ,0x20c,"spv_result_t spvtools::val::ValidationState_t::RegisterFunctionEnd()");
    }
  }
  if (this->in_function_ != false) {
    val::Function::RegisterFunctionEnd
              ((this->module_functions_).
               super__Vector_base<spvtools::val::Function,_std::allocator<spvtools::val::Function>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1);
    this->in_function_ = false;
    return SPV_SUCCESS;
  }
  __assert_fail("in_function_body()",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validation_state.cpp"
                ,0x14f,"Function &spvtools::val::ValidationState_t::current_function()");
}

Assistant:

spv_result_t ValidationState_t::RegisterFunctionEnd() {
  assert(in_function_body() == true &&
         "RegisterFunctionEnd can only be called when parsing the binary "
         "inside of another function");
  assert(in_block() == false &&
         "RegisterFunctionParameter can only be called when parsing the binary "
         "outside of a block");
  current_function().RegisterFunctionEnd();
  in_function_ = false;
  return SPV_SUCCESS;
}